

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLAttDef::XMLAttDef
          (XMLAttDef *this,AttTypes type,DefAttTypes defType,MemoryManager *manager)

{
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLAttDef_00407f78;
  this->fDefaultType = defType;
  this->fType = type;
  this->fCreateReason = NoReason;
  this->fExternalAttribute = false;
  this->fId = 0xfffffffe;
  this->fValue = (XMLCh *)0x0;
  this->fEnumeration = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  return;
}

Assistant:

XMLAttDef::XMLAttDef( const XMLAttDef::AttTypes    type
                    , const XMLAttDef::DefAttTypes defType
                    , MemoryManager* const         manager) :

    fDefaultType(defType)
    , fType(type)
    , fCreateReason(XMLAttDef::NoReason)
    , fExternalAttribute(false)
    , fId(XMLAttDef::fgInvalidAttrId)
    , fValue(0)
    , fEnumeration(0)
    , fMemoryManager(manager)
{
}